

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nativefunction.cpp
# Opt level: O2

void sos::NativeFunction::equals(VariableStack *stack)

{
  __type item;
  string sStack_48;
  string local_28;
  
  VariableStack::take_abi_cxx11_(&local_28,stack);
  VariableStack::take_abi_cxx11_(&sStack_48,stack);
  item = std::operator==(&local_28,&sStack_48);
  VariableStack::load(stack,item);
  std::__cxx11::string::~string((string *)&sStack_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void sos::NativeFunction::equals(sos::VariableStack *stack) {
    stack->load(stack->take() == stack->take());
}